

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

reference __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::GrowAndEmplaceBack<(anonymous_namespace)::CrossingGraphEdge>
          (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
           *this,CrossingGraphEdge *args)

{
  Rep *__s;
  undefined8 *puVar1;
  void *this_00;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  Rep *pRVar5;
  long lVar6;
  ulong uVar7;
  Rep *__s_00;
  
  this_00 = (void *)(this->allocator_and_tag_).tag_.size_;
  uVar7 = (ulong)this_00 >> 1;
  uVar3 = 2;
  if (((ulong)this_00 & 1) != 0) {
    uVar3 = *(ulong *)&this->rep_;
  }
  if (uVar7 == uVar3) {
    if (this_00 < (void *)0x800000000000000) {
      __s = &this->rep_;
      pvVar4 = operator_new(uVar7 << 5);
      uVar2 = *(undefined8 *)&args->outgoing;
      puVar1 = (undefined8 *)((long)pvVar4 + uVar7 * 0x10);
      *puVar1 = *(undefined8 *)args;
      puVar1[1] = uVar2;
      uVar3 = (this->allocator_and_tag_).tag_.size_;
      __s_00 = *(Rep **)((long)&this->rep_ + 8);
      pRVar5 = __s_00;
      if ((uVar3 & 1) == 0) {
        pRVar5 = __s;
      }
      if ((void *)0x1 < this_00) {
        lVar6 = 0;
        do {
          uVar2 = ((undefined8 *)((long)pRVar5 + lVar6))[1];
          *(undefined8 *)((long)pvVar4 + lVar6) = *(undefined8 *)((long)pRVar5 + lVar6);
          ((undefined8 *)((long)pvVar4 + lVar6))[1] = uVar2;
          lVar6 = lVar6 + 0x10;
        } while (uVar7 * 0x10 != lVar6);
      }
      if ((uVar3 & 1) == 0) {
        if (uVar3 != 0) {
          memset(__s,0xab,uVar3 << 3);
        }
      }
      else {
        if (1 < uVar3) {
          memset(__s_00,0xab,(uVar3 & 0x1ffffffffffffffe) << 3);
          __s_00 = *(Rep **)((long)&this->rep_ + 8);
          if (__s != __s_00 && ((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
            __assert_fail("begin() == allocated_space()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                          ,0x31b,
                          "void absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::ResetAllocation(Allocation, size_type) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>]"
                         );
          }
        }
        operator_delete(__s_00);
      }
      *(reference *)&this->rep_ = (reference)((ulong)this_00 & 0x7fffffffffffffe);
      *(void **)((long)&this->rep_ + 8) = pvVar4;
      (this->allocator_and_tag_).tag_.size_ = ((ulong)this_00 | 1) + 2;
      return (reference)((ulong)this_00 & 0x7fffffffffffffe);
    }
    InlinedVector<(anonymous_namespace)::CrossingGraphEdge,2ul,std::allocator<(anonymous_namespace)::CrossingGraphEdge>>
    ::GrowAndEmplaceBack<(anonymous_namespace)::CrossingGraphEdge>(this_00);
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::GrowAndEmplaceBack(Args &&...) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>, Args = <(anonymous namespace)::CrossingGraphEdge>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }